

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

int __thiscall GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>::Deg(MP<6UL,_GF2::MOGrevlex<6UL>_> *this)

{
  bool bVar1;
  const_iterator iter;
  int deg;
  int ret;
  list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *in_stack_ffffffffffffffc8;
  _Self local_28;
  _Self local_20;
  int local_18;
  int local_14;
  int local_4;
  
  bVar1 = IsEmpty((MP<6UL,_GF2::MOGrevlex<6UL>_> *)0x1c6678);
  if (bVar1) {
    local_4 = -1;
  }
  else {
    local_14 = 0;
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::begin
                   (in_stack_ffffffffffffffc8);
    while( true ) {
      local_28._M_node =
           (_List_node_base *)
           std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::end
                     (in_stack_ffffffffffffffc8);
      bVar1 = std::operator!=(&local_20,&local_28);
      if (!bVar1) break;
      std::_List_const_iterator<GF2::MM<6UL>_>::operator->
                ((_List_const_iterator<GF2::MM<6UL>_> *)0x1c66cd);
      local_18 = MM<6UL>::Deg((MM<6UL> *)0x1c66d5);
      if (local_14 < local_18) {
        local_14 = local_18;
      }
      std::_List_const_iterator<GF2::MM<6UL>_>::operator++(&local_20);
    }
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

int Deg() const
	{
		// нулевой многочлен?
		if (IsEmpty()) return -1;
		// максимум степеней мономов
		int ret = 0, deg;
		for (const_iterator iter = begin(); iter != end(); ++iter)
			if ((deg = iter->Deg()) > ret) ret = deg;
		return ret;
	}